

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderPackingFunctionTests::init
          (ShaderPackingFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  PackSnorm4x8Case *this_00;
  TestNode *pTVar2;
  PackUnorm4x8Case *this_01;
  PackSnorm2x16Case *this_02;
  PackUnorm2x16Case *this_03;
  bool bVar3;
  long lVar4;
  int prec;
  Precision PVar5;
  
  PVar5 = PRECISION_LOWP;
  do {
    lVar4 = 0;
    do {
      this_00 = (PackSnorm4x8Case *)operator_new(0x108);
      PackSnorm4x8Case::PackSnorm4x8Case
                (this_00,(this->super_TestCaseGroup).m_context,
                 *(ShaderType *)((long)&DAT_0096ab10 + lVar4),PVar5);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x18);
    PVar5 = PVar5 + PRECISION_MEDIUMP;
  } while (PVar5 != PRECISION_LAST);
  lVar4 = 0;
  do {
    pTVar2 = (TestNode *)operator_new(0x100);
    UnpackSnorm4x8Case::UnpackSnorm4x8Case
              ((UnpackSnorm4x8Case *)pTVar2,(this->super_TestCaseGroup).m_context,
               *(ShaderType *)((long)&DAT_0096ab10 + lVar4));
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x18);
  PVar5 = PRECISION_LOWP;
  do {
    lVar4 = 0;
    do {
      this_01 = (PackUnorm4x8Case *)operator_new(0x108);
      PackUnorm4x8Case::PackUnorm4x8Case
                (this_01,(this->super_TestCaseGroup).m_context,
                 *(ShaderType *)((long)&DAT_0096ab10 + lVar4),PVar5);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x18);
    PVar5 = PVar5 + PRECISION_MEDIUMP;
  } while (PVar5 != PRECISION_LAST);
  lVar4 = 0;
  do {
    pTVar2 = (TestNode *)operator_new(0x100);
    UnpackUnorm4x8Case::UnpackUnorm4x8Case
              ((UnpackUnorm4x8Case *)pTVar2,(this->super_TestCaseGroup).m_context,
               *(ShaderType *)((long)&DAT_0096ab10 + lVar4));
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x18);
  PVar5 = PRECISION_LOWP;
  do {
    lVar4 = 0;
    bVar1 = true;
    do {
      bVar3 = bVar1;
      this_02 = (PackSnorm2x16Case *)operator_new(0x108);
      PackSnorm2x16Case::PackSnorm2x16Case
                (this_02,(this->super_TestCaseGroup).m_context,(&DAT_0096ab98)[lVar4],PVar5);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
      lVar4 = 1;
      bVar1 = false;
    } while (bVar3);
    PVar5 = PVar5 + PRECISION_MEDIUMP;
  } while (PVar5 != PRECISION_LAST);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    pTVar2 = (TestNode *)operator_new(0x100);
    UnpackSnorm2x16Case::UnpackSnorm2x16Case
              ((UnpackSnorm2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,
               (&DAT_0096ab98)[lVar4]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    lVar4 = 1;
    PVar5 = PRECISION_LOWP;
    bVar1 = false;
  } while (bVar3);
  do {
    lVar4 = 0;
    bVar1 = true;
    do {
      bVar3 = bVar1;
      this_03 = (PackUnorm2x16Case *)operator_new(0x108);
      PackUnorm2x16Case::PackUnorm2x16Case
                (this_03,(this->super_TestCaseGroup).m_context,(&DAT_0096ab98)[lVar4],PVar5);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
      lVar4 = 1;
      bVar1 = false;
    } while (bVar3);
    PVar5 = PVar5 + PRECISION_MEDIUMP;
  } while (PVar5 != PRECISION_LAST);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    pTVar2 = (TestNode *)operator_new(0x100);
    UnpackUnorm2x16Case::UnpackUnorm2x16Case
              ((UnpackUnorm2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,
               (&DAT_0096ab98)[lVar4]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    lVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    pTVar2 = (TestNode *)operator_new(0x100);
    PackHalf2x16Case::PackHalf2x16Case
              ((PackHalf2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,
               (&DAT_0096ab98)[lVar4]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    lVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    pTVar2 = (TestNode *)operator_new(0x100);
    UnpackHalf2x16Case::UnpackHalf2x16Case
              ((UnpackHalf2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,
               (&DAT_0096ab98)[lVar4]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    lVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  return extraout_EAX;
}

Assistant:

void ShaderPackingFunctionTests::init (void)
{
	// New built-in functions in GLES 3.1
	{
		const glu::ShaderType allShaderTypes[] =
		{
			glu::SHADERTYPE_VERTEX,
			glu::SHADERTYPE_TESSELLATION_CONTROL,
			glu::SHADERTYPE_TESSELLATION_EVALUATION,
			glu::SHADERTYPE_GEOMETRY,
			glu::SHADERTYPE_FRAGMENT,
			glu::SHADERTYPE_COMPUTE
		};

		// packSnorm4x8
		for (int prec = 0; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
				addChild(new PackSnorm4x8Case(m_context, allShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackSnorm4x8
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
			addChild(new UnpackSnorm4x8Case(m_context, allShaderTypes[shaderTypeNdx]));

		// packUnorm4x8
		for (int prec = 0; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
				addChild(new PackUnorm4x8Case(m_context, allShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackUnorm4x8
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
			addChild(new UnpackUnorm4x8Case(m_context, allShaderTypes[shaderTypeNdx]));
	}

	// GLES 3 functions in new shader types.
	{
		const glu::ShaderType newShaderTypes[] =
		{
			glu::SHADERTYPE_GEOMETRY,
			glu::SHADERTYPE_COMPUTE
		};

		// packSnorm2x16
		for (int prec = 0; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
				addChild(new PackSnorm2x16Case(m_context, newShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackSnorm2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackSnorm2x16Case(m_context, newShaderTypes[shaderTypeNdx]));

		// packUnorm2x16
		for (int prec = 0; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
				addChild(new PackUnorm2x16Case(m_context, newShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackUnorm2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackUnorm2x16Case(m_context, newShaderTypes[shaderTypeNdx]));

		// packHalf2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new PackHalf2x16Case(m_context, newShaderTypes[shaderTypeNdx]));

		// unpackHalf2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackHalf2x16Case(m_context, newShaderTypes[shaderTypeNdx]));
	}
}